

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglThreadCleanUpTests.cpp
# Opt level: O0

TestCaseGroup * deqp::egl::createThreadCleanUpTest(EglTestContext *eglTestCtx)

{
  TestCaseGroup *pTVar1;
  ThreadCleanUpTest *pTVar2;
  DefaultDeleter<deqp::egl::TestCaseGroup> local_2d [13];
  undefined1 local_20 [8];
  MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_> group;
  EglTestContext *eglTestCtx_local;
  
  group.super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>.
  m_data._8_8_ = eglTestCtx;
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"thread_cleanup","Thread cleanup tests");
  de::DefaultDeleter<deqp::egl::TestCaseGroup>::DefaultDeleter(local_2d);
  de::details::MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
  MovePtr((MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_> *)
          local_20,pTVar1);
  pTVar1 = de::details::
           UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
           operator->((UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                       *)local_20);
  pTVar2 = (ThreadCleanUpTest *)operator_new(0xb0);
  anon_unknown_0::ThreadCleanUpTest::ThreadCleanUpTest
            (pTVar2,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,CONTEXTTYPE_SINGLE,SURFACETYPE_SINGLE);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pTVar2);
  pTVar1 = de::details::
           UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
           operator->((UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                       *)local_20);
  pTVar2 = (ThreadCleanUpTest *)operator_new(0xb0);
  anon_unknown_0::ThreadCleanUpTest::ThreadCleanUpTest
            (pTVar2,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,CONTEXTTYPE_MULTI,SURFACETYPE_SINGLE);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pTVar2);
  pTVar1 = de::details::
           UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
           operator->((UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                       *)local_20);
  pTVar2 = (ThreadCleanUpTest *)operator_new(0xb0);
  anon_unknown_0::ThreadCleanUpTest::ThreadCleanUpTest
            (pTVar2,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,CONTEXTTYPE_SINGLE,SURFACETYPE_MULTI);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pTVar2);
  pTVar1 = de::details::
           UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
           operator->((UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                       *)local_20);
  pTVar2 = (ThreadCleanUpTest *)operator_new(0xb0);
  anon_unknown_0::ThreadCleanUpTest::ThreadCleanUpTest
            (pTVar2,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,CONTEXTTYPE_MULTI,SURFACETYPE_MULTI);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pTVar2);
  pTVar1 = de::details::
           MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::release
                     ((MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                       *)local_20);
  de::details::MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
  ~MovePtr((MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_> *)
           local_20);
  return pTVar1;
}

Assistant:

TestCaseGroup* createThreadCleanUpTest (EglTestContext& eglTestCtx)
{
	de::MovePtr<TestCaseGroup> group (new TestCaseGroup(eglTestCtx, "thread_cleanup", "Thread cleanup tests"));

	group->addChild(new ThreadCleanUpTest(eglTestCtx, ThreadCleanUpTest::CONTEXTTYPE_SINGLE,	ThreadCleanUpTest::SURFACETYPE_SINGLE));
	group->addChild(new ThreadCleanUpTest(eglTestCtx, ThreadCleanUpTest::CONTEXTTYPE_MULTI,		ThreadCleanUpTest::SURFACETYPE_SINGLE));

	group->addChild(new ThreadCleanUpTest(eglTestCtx, ThreadCleanUpTest::CONTEXTTYPE_SINGLE,	ThreadCleanUpTest::SURFACETYPE_MULTI));
	group->addChild(new ThreadCleanUpTest(eglTestCtx, ThreadCleanUpTest::CONTEXTTYPE_MULTI,		ThreadCleanUpTest::SURFACETYPE_MULTI));

	return group.release();
}